

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_special_functions.cc
# Opt level: O2

tuple<float,_float> bounds<float>(float y)

{
  _Tuple_impl<0UL,_float,_float> *in_RDI;
  float fVar1;
  float fVar3;
  _Tuple_impl<0UL,_float,_float> _Var2;
  uint uVar4;
  float fVar5;
  uint uVar6;
  
  fVar1 = y * 0.99999714;
  fVar3 = y * 1.0000029;
  uVar4 = (int)((uint)(fVar3 < fVar1) << 0x1f) >> 0x1f;
  uVar6 = (int)((uint)(fVar3 < fVar1) << 0x1f) >> 0x1f;
  fVar5 = (float)(~uVar4 & (uint)fVar3 | (uint)fVar1 & uVar4);
  fVar1 = (float)(~uVar6 & (uint)fVar1 | (uint)fVar3 & uVar6);
  uVar4 = -(uint)(ABS(fVar5) < 2.8211864e-37);
  uVar6 = -(uint)(ABS(fVar1) < 2.8211864e-37);
  _Var2 = (_Tuple_impl<0UL,_float,_float>)
          (CONCAT44(uVar6,uVar4) & 0x82c0000002c00000 |
          CONCAT44(~uVar6 & (uint)fVar1,~uVar4 & (uint)fVar5));
  *in_RDI = _Var2;
  return (tuple<float,_float>)_Var2;
}

Assistant:

std::tuple<T, T> bounds(T y) {
  const T tol{std::numeric_limits<T>::digits *
              std::log2(static_cast<T>(std::numeric_limits<T>::radix))};
  const T eps{tol * std::numeric_limits<T>::epsilon()};
  const T min{tol * std::numeric_limits<T>::min()};
  T y_min{(1 - eps) * y};
  T y_max{(1 + eps) * y};
  if (y_min > y_max)
    std::swap(y_min, y_max);
  if (std::abs(y_min) < min)
    y_min = -min;
  if (std::abs(y_max) < min)
    y_max = +min;
  return {y_min, y_max};
}